

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool IntBounds::IsGreaterThanOrEqualTo(int constantValue,int constantBoundBase,int offset)

{
  int iVar1;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  int constantBound;
  int offset_local;
  int constantBoundBase_local;
  int constantValue_local;
  
  if (offset == 0) {
    constantBoundBase_local._3_1_ = constantBoundBase <= constantValue;
  }
  else if (offset == 1) {
    constantBoundBase_local._3_1_ = constantBoundBase < constantValue;
  }
  else {
    iVar1 = constantBoundBase + offset;
    if (offset < 0) {
      local_1f = constantBoundBase <= iVar1 || iVar1 <= constantValue;
      local_1e = local_1f;
    }
    else {
      local_1d = constantBoundBase <= iVar1 && iVar1 <= constantValue;
      local_1e = local_1d;
    }
    constantBoundBase_local._3_1_ = local_1e;
  }
  return constantBoundBase_local._3_1_;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const int constantValue, const int constantBoundBase, const int offset)
{
    if(offset == 0)
        return constantValue >= constantBoundBase;
    if(offset == 1)
        return constantValue > constantBoundBase;

    // use unsigned to avoid signed int overflow
    const int constantBound = (unsigned)constantBoundBase + (unsigned)offset;
    return
        offset >= 0
            ? constantBound >= constantBoundBase && constantValue >= constantBound
            : constantBound >= constantBoundBase || constantValue >= constantBound;
}